

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicHandleInfo.hpp
# Opt level: O0

void __thiscall
helics::BasicHandleInfo::BasicHandleInfo
          (BasicHandleInfo *this,GlobalFederateId federate_id,InterfaceHandle handle_id,
          InterfaceType type_of_handle)

{
  undefined1 in_CL;
  InterfaceHandle in_EDX;
  GlobalFederateId in_ESI;
  GlobalHandle *in_RDI;
  undefined4 in_stack_ffffffffffffffe0;
  
  GlobalHandle::GlobalHandle(in_RDI,in_ESI,in_EDX);
  memset(in_RDI + 1,0,4);
  LocalFederateId::LocalFederateId((LocalFederateId *)(in_RDI + 1));
  *(undefined1 *)&in_RDI[1].handle.hid = in_CL;
  *(undefined1 *)((long)&in_RDI[1].handle.hid + 1) = 0;
  *(undefined2 *)((long)&in_RDI[1].handle.hid + 2) = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_EDX.hid,in_stack_ffffffffffffffe0));
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_EDX.hid,in_stack_ffffffffffffffe0));
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_EDX.hid,in_stack_ffffffffffffffe0));
  in_RDI[0xe] = (GlobalHandle)(in_RDI + 6);
  in_RDI[0xf] = (GlobalHandle)(in_RDI + 10);
  CLI::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x60a7c6);
  return;
}

Assistant:

BasicHandleInfo(GlobalFederateId federate_id,
                    InterfaceHandle handle_id,
                    InterfaceType type_of_handle) noexcept:
        handle{federate_id, handle_id}, handleType(type_of_handle), type_in(type), type_out(units)
    {
    }